

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::SeparationPart::Decode(SeparationPart *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    KDataStream::Read(stream,&(this->super_VariableParameter).m_ui8VarParamType);
    KDataStream::Read(stream,&this->m_ui8Reason);
    KDataStream::Read(stream,&this->m_ui8PreEntIndicator);
    KDataStream::Read(stream,&this->m_ui8Padding);
    (*(this->m_ParentEntId).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ParentEntId,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    (*(this->m_StationLoc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_StationLoc,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void SeparationPart::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VariableParameter::VARIABLE_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8VarParamType
           >> m_ui8Reason
           >> m_ui8PreEntIndicator
           >> m_ui8Padding
           >> KDIS_STREAM m_ParentEntId
           >> m_ui16Padding
           >> KDIS_STREAM m_StationLoc;
}